

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,false,true>
               (interval_t *ldata,timestamp_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  timestamp_t tVar10;
  timestamp_t tVar11;
  ulong uVar12;
  ulong uVar13;
  int64_t *piVar14;
  idx_t iVar15;
  ulong uVar16;
  ulong uVar17;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      tVar11 = (timestamp_t)rdata->value;
      piVar14 = &ldata->micros;
      iVar15 = 0;
      do {
        uVar3 = ((interval_t *)(piVar14 + -1))->months;
        uVar8 = ((interval_t *)(piVar14 + -1))->days;
        right_01.days = uVar8;
        right_01.months = uVar3;
        right_01.micros = *piVar14;
        tVar10 = Interval::Add(tVar11,right_01);
        result_data[iVar15].value = tVar10.value;
        iVar15 = iVar15 + 1;
        piVar14 = piVar14 + 2;
      } while (count != iVar15);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar13 = 0;
    uVar12 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar16 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar16 = count;
        }
LAB_01446ec0:
        uVar9 = uVar13;
        if (uVar13 < uVar16) {
          tVar11 = (timestamp_t)rdata->value;
          piVar14 = &ldata[uVar13].micros;
          do {
            uVar1 = ((interval_t *)(piVar14 + -1))->months;
            uVar6 = ((interval_t *)(piVar14 + -1))->days;
            right.days = uVar6;
            right.months = uVar1;
            right.micros = *piVar14;
            tVar10 = Interval::Add(tVar11,right);
            result_data[uVar13].value = tVar10.value;
            uVar13 = uVar13 + 1;
            piVar14 = piVar14 + 2;
            uVar9 = uVar16;
          } while (uVar16 != uVar13);
        }
      }
      else {
        uVar5 = puVar4[uVar12];
        uVar16 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar16 = count;
        }
        uVar9 = uVar16;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) goto LAB_01446ec0;
          uVar9 = uVar13;
          if (uVar13 < uVar16) {
            piVar14 = &ldata[uVar13].micros;
            uVar17 = 0;
            do {
              if ((uVar5 >> (uVar17 & 0x3f) & 1) != 0) {
                uVar2 = ((interval_t *)(piVar14 + -1))->months;
                uVar7 = ((interval_t *)(piVar14 + -1))->days;
                right_00.days = uVar7;
                right_00.months = uVar2;
                right_00.micros = *piVar14;
                tVar11 = Interval::Add(rdata->value,right_00);
                result_data[uVar13 + uVar17].value = tVar11.value;
              }
              uVar17 = uVar17 + 1;
              piVar14 = piVar14 + 2;
              uVar9 = uVar16;
            } while (uVar16 - uVar13 != uVar17);
          }
        }
      }
      uVar13 = uVar9;
      uVar12 = uVar12 + 1;
    } while (uVar12 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}